

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_compute_log(float64 **den,uint32 **den_idx,vector_t *obs,gauden_t *g,uint32 mgau,
                      uint32 **prev_den_idx)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint32 *local_48;
  
  uVar1 = g->n_density;
  uVar2 = g->n_top;
  if (uVar1 < uVar2) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x4c7,
                  "int gauden_compute_log(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                 );
  }
  if (g->fullvar == (vector_t ****)0x0) {
    if (uVar2 == uVar1) {
      for (uVar3 = 0; uVar3 < g->n_feat; uVar3 = uVar3 + 1) {
        log_full_densities(den[uVar3],den_idx[uVar3],g->n_density,g->veclen[uVar3],obs[uVar3],
                           g->mean[mgau][uVar3],g->var[mgau][uVar3],g->norm[mgau][uVar3]);
      }
    }
    else {
      if (uVar1 <= uVar2) {
        __assert_fail("g->n_top < g->n_density",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x4e4,
                      "int gauden_compute_log(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                     );
      }
      for (uVar3 = 0; uVar3 < g->n_feat; uVar3 = uVar3 + 1) {
        if (prev_den_idx == (uint32 **)0x0) {
          local_48 = (uint32 *)0x0;
        }
        else {
          local_48 = prev_den_idx[uVar3];
        }
        log_topn_densities(den[uVar3],den_idx[uVar3],g->n_top,g->n_density,g->veclen[uVar3],
                           obs[uVar3],g->mean[mgau][uVar3],g->var[mgau][uVar3],g->norm[mgau][uVar3],
                           local_48);
      }
    }
  }
  else {
    if (uVar2 != uVar1) {
      __assert_fail("g->n_top == g->n_density",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x4cb,
                    "int gauden_compute_log(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                   );
    }
    for (uVar3 = 0; uVar3 < g->n_feat; uVar3 = uVar3 + 1) {
      log_full_densities_full
                (den[uVar3],den_idx[uVar3],g->n_density,g->veclen[uVar3],obs[uVar3],
                 g->mean[mgau][uVar3],g->fullvar[mgau][uVar3],g->norm[mgau][uVar3]);
    }
  }
  return 0;
}

Assistant:

int
gauden_compute_log(float64 **den,		/* density array for a mixture Gaussian */
		   uint32 **den_idx,	/* density index array for n_top < n_density eval */
		   vector_t *obs,		/* observation vector for some time */
		   gauden_t *g,		/* Gaussian density structure */
		   uint32 mgau,		/* id of the mixture Gau. to evaluate */
		   uint32 **prev_den_idx)   /* Previous frame's top N densities (or NULL) */
{
    uint32 j;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    /* Top-N computation not (yet) possible for full covariances */
    if (g->fullvar) {
	assert(g->n_top == g->n_density);
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities_full(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->fullvar[mgau][j],
			       g->norm[mgau][j]);
	}
    }
    else if (g->n_top == g->n_density) {
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j]);
	}
    }
    else {
	assert(g->n_top < g->n_density);

	for (j = 0; j < g->n_feat; j++) {
	    log_topn_densities(den[j],
			       den_idx[j],
			       g->n_top,
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j],
			       prev_den_idx ? prev_den_idx[j] : NULL);
	}
    }


#ifdef GAUDEN_VERBOSE
    gauden_print(stdout,
		 den, den_idx, g,
		 global_map, n_global_map);
#endif

    return S3_SUCCESS;
}